

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O0

void __thiscall
amrex::BndryRegister::define
          (BndryRegister *this,BoxArray *grids_,DistributionMapping *dmap,int in_rad,int out_rad,
          int extent_rad,int ncomp)

{
  void *pvVar1;
  undefined4 in_stack_00000008;
  OrientationIter face;
  int in_stack_0000009c;
  int in_stack_000000a0;
  int in_stack_000000a4;
  BndryRegister *in_stack_000000a8;
  IndexType in_stack_000000b0;
  Orientation in_stack_000000b4;
  int in_stack_000000c0;
  DistributionMapping *in_stack_000000c8;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  BoxArray *in_stack_ffffffffffffffb0;
  OrientationIter local_30 [11];
  IndexType local_4;
  
  BoxArray::operator=(in_stack_ffffffffffffffb0,
                      (BoxArray *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  OrientationIter::OrientationIter(local_30);
  while( true ) {
    pvVar1 = OrientationIter::operator_cast_to_void_(local_30);
    if (pvVar1 == (void *)0x0) break;
    OrientationIter::operator()
              ((OrientationIter *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    IndexType::IndexType(&local_4,CELL,CELL,CELL);
    in_stack_ffffffffffffffa8 = in_stack_00000008;
    define(in_stack_000000a8,in_stack_000000b4,in_stack_000000b0,in_stack_000000a4,in_stack_000000a0
           ,in_stack_0000009c,in_stack_000000c0,in_stack_000000c8);
    OrientationIter::operator++(local_30);
  }
  return;
}

Assistant:

void
BndryRegister::define (const BoxArray& grids_,
                       const DistributionMapping& dmap,
                       int             in_rad,
                       int             out_rad,
                       int             extent_rad,
                       int             ncomp)
{
    grids = grids_;
    for (OrientationIter face; face; ++face)
    {
        define(face(),IndexType::TheCellType(),in_rad,out_rad,extent_rad,ncomp,dmap);
    }
}